

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddCustomCommandToCreateObject
          (cmLocalGenerator *this,char *ofname,string *lang,cmSourceFile *source,
          cmGeneratorTarget *target)

{
  pointer *this_00;
  cmMakefile *this_01;
  undefined8 uVar1;
  bool bVar2;
  string *psVar3;
  char *pcVar4;
  reference s;
  iterator __first;
  iterator __last;
  char *workingDir;
  undefined1 auVar5 [16];
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  string local_448;
  allocator local_421;
  string local_420 [8];
  string comment;
  string local_3f8;
  allocator local_3d1;
  string local_3d0;
  char *local_3b0;
  char *additionalDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_378;
  const_iterator local_370;
  undefined1 local_368 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmd;
  cmCustomCommandLine commandLine;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_330;
  iterator i;
  RuleVariables vars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  cmCustomCommandLines commandLines;
  string local_218;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  undefined1 local_1b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string flags;
  value_type local_170;
  undefined1 local_150 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rules;
  undefined1 local_130 [8];
  string varString;
  string sourceFile;
  string local_e8;
  undefined1 local_c8 [8];
  string objectFile;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  string objectDir;
  cmGeneratorTarget *target_local;
  cmSourceFile *source_local;
  string *lang_local;
  char *ofname_local;
  cmLocalGenerator *this_local;
  
  objectDir.field_2._8_8_ = target;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,ofname,&local_71);
  cmsys::SystemTools::GetFilenamePath((string *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  cmOutputConverter::Convert
            ((string *)((long)&objectFile.field_2 + 8),&this->super_cmOutputConverter,
             (string *)local_50,START_OUTPUT,SHELL);
  std::__cxx11::string::operator=
            ((string *)local_50,(string *)(objectFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(objectFile.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,ofname,(allocator *)(sourceFile.field_2._M_local_buf + 0xf));
  cmOutputConverter::Convert
            ((string *)local_c8,&this->super_cmOutputConverter,&local_e8,START_OUTPUT,SHELL);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(sourceFile.field_2._M_local_buf + 0xf));
  psVar3 = cmSourceFile::GetFullPath(source,(string *)0x0);
  cmOutputConverter::ConvertToOutputFormat
            ((string *)((long)&varString.field_2 + 8),&this->super_cmOutputConverter,psVar3,SHELL);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_130,"CMAKE_",
             (allocator *)
             ((long)&rules.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rules.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::operator+=((string *)local_130,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_130,"_COMPILE_OBJECT");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_150);
  pcVar4 = cmMakefile::GetRequiredDefinition(this->Makefile,(string *)local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_170,pcVar4,(allocator *)(flags.field_2._M_local_buf + 0xf));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)(flags.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator=((string *)local_130,"CMAKE_");
  std::__cxx11::string::operator+=((string *)local_130,(string *)lang);
  std::__cxx11::string::operator+=((string *)local_130,"_FLAGS");
  std::__cxx11::string::string
            ((string *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_130);
  std::__cxx11::string::operator+=
            ((string *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar4);
  std::__cxx11::string::operator+=
            ((string *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage," ");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1b0);
  uVar1 = objectDir.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"",&local_1d1);
  GetIncludeDirectories
            (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b0,(cmGeneratorTarget *)uVar1,lang,&local_1d0,true);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  uVar1 = objectDir.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_218,"",
             (allocator *)
             ((long)&commandLines.
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  GetIncludeFlags(&local_1f8,this,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b0,(cmGeneratorTarget *)uVar1,lang,false,false,&local_218);
  std::__cxx11::string::operator+=
            ((string *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&commandLines.
                     super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b0);
  pcVar4 = cmMakefile::GetDefineFlags(this->Makefile);
  std::__cxx11::string::operator+=
            ((string *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar4);
  cmCustomCommandLines::cmCustomCommandLines
            ((cmCustomCommandLines *)
             &commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&vars.FilterPrefix);
  cmSystemTools::ExpandList
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_150,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&vars.FilterPrefix);
  RuleVariables::RuleVariables((RuleVariables *)&i);
  vars.TargetVersionMinor = (char *)std::__cxx11::string::c_str();
  vars.LinkLibraries = (char *)std::__cxx11::string::c_str();
  vars.Output = (char *)std::__cxx11::string::c_str();
  vars.Object = (char *)std::__cxx11::string::c_str();
  vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
  local_330._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&vars.FilterPrefix);
  while( true ) {
    commandLine.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&vars.FilterPrefix);
    bVar2 = __gnu_cxx::operator!=
                      (&local_330,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&commandLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    s = __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_330);
    ExpandRuleVariables(this,s,(RuleVariables *)&i);
    cmCustomCommandLine::cmCustomCommandLine
              ((cmCustomCommandLine *)
               &cmd.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_330);
    auVar5 = std::__cxx11::string::c_str();
    cmSystemTools::ParseArguments_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_368,auVar5._0_8_,auVar5._8_8_);
    this_00 = &cmd.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_378._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_370,&local_378);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_368);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_368);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             this_00,local_370,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )__first._M_current,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )__last._M_current);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (value_type *)
               &cmd.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_368);
    cmCustomCommandLine::~cmCustomCommandLine
              ((cmCustomCommandLine *)
               &cmd.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_330);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&additionalDeps);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d0,"OBJECT_DEPENDS",&local_3d1);
  pcVar4 = cmSourceFile::GetProperty(source,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  local_3b0 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3f8,pcVar4,(allocator *)(comment.field_2._M_local_buf + 0xf));
    cmSystemTools::ExpandListArgument
              (&local_3f8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&additionalDeps,false);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)(comment.field_2._M_local_buf + 0xf));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"Building ",&local_421);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::__cxx11::string::operator+=(local_420,(string *)lang);
  std::__cxx11::string::operator+=(local_420," object ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,ofname,&local_469);
  cmOutputConverter::Convert
            (&local_448,&this->super_cmOutputConverter,&local_468,START_OUTPUT,UNCHANGED);
  std::__cxx11::string::operator+=(local_420,(string *)&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  this_01 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_490,ofname,&local_491);
  psVar3 = cmSourceFile::GetFullPath(source,(string *)0x0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  workingDir = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  cmMakefile::AddCustomCommandToOutput
            (this_01,&local_490,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&additionalDeps,psVar3,
             (cmCustomCommandLines *)
             &commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar4,workingDir,false,true,false)
  ;
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::__cxx11::string::~string(local_420);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&additionalDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&vars.FilterPrefix);
  cmCustomCommandLines::~cmCustomCommandLines
            ((cmCustomCommandLines *)
             &commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_150);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)(varString.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmLocalGenerator::AddCustomCommandToCreateObject(const char* ofname,
                                                    const std::string& lang,
                                                    cmSourceFile& source,
                                                    cmGeneratorTarget& target)
{
  std::string objectDir = cmSystemTools::GetFilenamePath(std::string(ofname));
  objectDir = this->Convert(objectDir,START_OUTPUT,SHELL);
  std::string objectFile = this->Convert(ofname,START_OUTPUT,SHELL);
  std::string sourceFile =
      this->ConvertToOutputFormat(source.GetFullPath(), SHELL);
  std::string varString = "CMAKE_";
  varString += lang;
  varString += "_COMPILE_OBJECT";
  std::vector<std::string> rules;
  rules.push_back(this->Makefile->GetRequiredDefinition(varString));
  varString = "CMAKE_";
  varString += lang;
  varString += "_FLAGS";
  std::string flags;
  flags += this->Makefile->GetSafeDefinition(varString);
  flags += " ";
    {
    std::vector<std::string> includes;
    this->GetIncludeDirectories(includes, &target, lang);
    flags += this->GetIncludeFlags(includes, &target, lang);
    }
  flags += this->Makefile->GetDefineFlags();

  // Construct the command lines.
  cmCustomCommandLines commandLines;
  std::vector<std::string> commands;
  cmSystemTools::ExpandList(rules, commands);
  cmLocalGenerator::RuleVariables vars;
  vars.Language = lang.c_str();
  vars.Source = sourceFile.c_str();
  vars.Object = objectFile.c_str();
  vars.ObjectDir = objectDir.c_str();
  vars.Flags = flags.c_str();
  for(std::vector<std::string>::iterator i = commands.begin();
      i != commands.end(); ++i)
    {
    // Expand the full command line string.
    this->ExpandRuleVariables(*i, vars);

    // Parse the string to get the custom command line.
    cmCustomCommandLine commandLine;
    std::vector<std::string> cmd = cmSystemTools::ParseArguments(i->c_str());
    commandLine.insert(commandLine.end(), cmd.begin(), cmd.end());

    // Store this command line.
    commandLines.push_back(commandLine);
    }

  // Check for extra object-file dependencies.
  std::vector<std::string> depends;
  const char* additionalDeps = source.GetProperty("OBJECT_DEPENDS");
  if(additionalDeps)
    {
    cmSystemTools::ExpandListArgument(additionalDeps, depends);
    }

  // Generate a meaningful comment for the command.
  std::string comment = "Building ";
  comment += lang;
  comment += " object ";
  comment += this->Convert(ofname, START_OUTPUT);

  // Add the custom command to build the object file.
  this->Makefile->AddCustomCommandToOutput(
    ofname,
    depends,
    source.GetFullPath(),
    commandLines,
    comment.c_str(),
    this->StateSnapshot.GetCurrentBinaryDirectory()
    );
}